

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amd.h
# Opt level: O1

int Eigen::internal::cs_tdfs<int>(int j,int k,int *head,int *next,int *post,int *stack)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  undefined4 in_R10D;
  int iVar4;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(head == (int *)0x0);
  auVar5._4_4_ = -(uint)(next == (int *)0x0);
  auVar5._8_4_ = -(uint)(post == (int *)0x0);
  auVar5._12_4_ = -(uint)(stack == (int *)0x0);
  iVar4 = movmskps(in_R10D,auVar5);
  if (iVar4 != 0) {
    return -1;
  }
  *stack = j;
  uVar3 = 0;
  do {
    iVar4 = stack[uVar3];
    iVar1 = head[iVar4];
    if ((long)iVar1 == -1) {
      uVar3 = uVar3 - 1;
      lVar2 = (long)k;
      k = k + 1;
      post[lVar2] = iVar4;
    }
    else {
      head[iVar4] = next[iVar1];
      stack[(ulong)uVar3 + 1] = iVar1;
      uVar3 = uVar3 + 1;
    }
  } while (-1 < (int)uVar3);
  return k;
}

Assistant:

StorageIndex cs_tdfs(StorageIndex j, StorageIndex k, StorageIndex *head, const StorageIndex *next, StorageIndex *post, StorageIndex *stack)
{
  StorageIndex i, p, top = 0;
  if(!head || !next || !post || !stack) return (-1);    /* check inputs */
  stack[0] = j;                 /* place j on the stack */
  while (top >= 0)                /* while (stack is not empty) */
  {
    p = stack[top];           /* p = top of stack */
    i = head[p];              /* i = youngest child of p */
    if(i == -1)
    {
      top--;                 /* p has no unordered children left */
      post[k++] = p;        /* node p is the kth postordered node */
    }
    else
    {
      head[p] = next[i];   /* remove i from children of p */
      stack[++top] = i;     /* start dfs on child node i */
    }
  }
  return k;
}